

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

string * __thiscall
front::irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(irGenerator *this,TyKind kind)

{
  void *pvVar1;
  key_type *__k;
  mapped_type *pmVar2;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  Variable variable;
  SharedTyPtr ty;
  string *name;
  Variable *in_stack_fffffffffffffe58;
  Variable *in_stack_fffffffffffffe60;
  SharedTyPtr *in_stack_fffffffffffffe68;
  Variable *in_stack_fffffffffffffe70;
  SharedTyPtr *in_stack_fffffffffffffe78;
  PtrTy *in_stack_fffffffffffffe80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  uint32_t id;
  irGenerator *in_stack_fffffffffffffeb8;
  Variable *in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  irGenerator *in_stack_ffffffffffffff00;
  string local_c8 [39];
  undefined1 local_a1;
  byte local_29;
  int local_14;
  
  id = (uint32_t)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  local_14 = in_EDX;
  std::shared_ptr<mir::types::Ty>::shared_ptr((shared_ptr<mir::types::Ty> *)0x25c46b);
  local_29 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  mir::inst::Variable::Variable(in_stack_fffffffffffffe60);
  if (local_14 == 0) {
    operator_new(8);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffe60);
    std::shared_ptr<mir::types::IntTy>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::IntTy> *)in_stack_fffffffffffffe60,
               (IntTy *)in_stack_fffffffffffffe58);
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe60,
               (shared_ptr<mir::types::IntTy> *)in_stack_fffffffffffffe58);
    std::shared_ptr<mir::types::IntTy>::~shared_ptr((shared_ptr<mir::types::IntTy> *)0x25c51e);
  }
  else if (local_14 == 3) {
    in_stack_fffffffffffffeb8 = (irGenerator *)operator_new(0x18);
    local_a1 = 1;
    pvVar1 = operator_new(8);
    id = (uint32_t)((ulong)pvVar1 >> 0x20);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffe60);
    std::shared_ptr<mir::types::IntTy>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::IntTy> *)in_stack_fffffffffffffe60,
               (IntTy *)in_stack_fffffffffffffe58);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe60,
               (shared_ptr<mir::types::IntTy> *)in_stack_fffffffffffffe58);
    mir::types::PtrTy::PtrTy(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_a1 = 0;
    std::shared_ptr<mir::types::PtrTy>::shared_ptr<mir::types::PtrTy,void>
              ((shared_ptr<mir::types::PtrTy> *)in_stack_fffffffffffffe60,
               (PtrTy *)in_stack_fffffffffffffe58);
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe60,
               (shared_ptr<mir::types::PtrTy> *)in_stack_fffffffffffffe58);
    std::shared_ptr<mir::types::PtrTy>::~shared_ptr((shared_ptr<mir::types::PtrTy> *)0x25c617);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25c624);
    std::shared_ptr<mir::types::IntTy>::~shared_ptr((shared_ptr<mir::types::IntTy> *)0x25c631);
  }
  __k = (key_type *)(in_RSI + 0x210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe60);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](in_stack_fffffffffffffea0,__k);
  getTmpName_abi_cxx11_(in_stack_fffffffffffffeb8,id);
  std::__cxx11::string::operator=((string *)in_RDI,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::shared_ptr<mir::types::Ty>::shared_ptr
            ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe60,
             (shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe58);
  mir::inst::Variable::Variable
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x30,0),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x28,0));
  mir::inst::Variable::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  mir::inst::Variable::~Variable((Variable *)0x25c797);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25c7a4);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,(string *)in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe60);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                *)pmVar2,__k);
  insertLocalValue(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffee8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RSI + 0x210));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                         *)pmVar2,__k);
  pmVar2->_nowTmpId = pmVar2->_nowTmpId + 1;
  local_29 = 1;
  mir::inst::Variable::~Variable((Variable *)0x25c87e);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25c8f7);
  return in_RDI;
}

Assistant:

string irGenerator::getNewTmpValueName(TyKind kind) {
  SharedTyPtr ty;
  string name;
  Variable variable;

  switch (kind) {
    case mir::types::TyKind::Int:
      ty = shared_ptr<IntTy>(new IntTy());
      break;
    case mir::types::TyKind::Ptr:
      ty = shared_ptr<PtrTy>(new PtrTy(shared_ptr<IntTy>(new IntTy())));
      break;
    default:
      break;
  }

  name = getTmpName(_funcNameToFuncData[_funcStack.back()]._nowTmpId);
  variable = Variable(ty, false, true);
  insertLocalValue(name, _funcNameToFuncData[_funcStack.back()]._nowTmpId,
                   variable);
  _funcNameToFuncData[_funcStack.back()]._nowTmpId++;
  ;
  return name;
}